

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult
cmCMakePresetsGraphInternal::EnvironmentMapHelper
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  
  if (EnvironmentMapHelper(std::map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>&,Json::Value_const*)
      ::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&EnvironmentMapHelper(std::map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>&,Json::Value_const*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      MapFilter<std::optional<std::__cxx11::string>,cmCMakePresetsGraph::ReadFileResult(*)(std::optional<std::__cxx11::string>&,Json::Value_const*),cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Map<std::optional<std::__cxx11::string>,cmCMakePresetsGraph::ReadFileResult(*)(std::optional<std::__cxx11::string>&,Json::Value_const*)>(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult(*)(std::optional<std::__cxx11::string>&,Json::Value_const*))::_lambda(std::__cxx11::string_const&)_1_>
                (&EnvironmentMapHelper(std::map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>&,Json::Value_const*)
                  ::helper_abi_cxx11_,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,10,
                 anon_unknown.dwarf_199d36::EnvironmentHelper);
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &EnvironmentMapHelper(std::map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>&,Json::Value_const*)
                    ::helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&EnvironmentMapHelper(std::map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>&,Json::Value_const*)
                           ::helper_abi_cxx11_);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&,_const_Json::Value_*)>
          ::operator()(&EnvironmentMapHelper(std::map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>&,Json::Value_const*)
                        ::helper_abi_cxx11_,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult EnvironmentMapHelper(
  std::map<std::string, cm::optional<std::string>>& out,
  const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Map<cm::optional<std::string>>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET,
    EnvironmentHelper);

  return helper(out, value);
}